

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcard.cpp
# Opt level: O0

xcard * __thiscall xcard::generateCard_abi_cxx11_(xcard *this)

{
  bool bVar1;
  result_type rVar2;
  longlong lVar3;
  string *psVar4;
  xcard *in_RSI;
  __cxx11 local_1410 [32];
  int local_13f0;
  byte local_13e9;
  int i;
  int local_13e4;
  int genreq;
  int initial_length;
  uniform_int_distribution<unsigned_int> dist;
  default_random_engine generator;
  undefined1 local_13c0 [8];
  random_device rd;
  string cardbuf;
  xcard *this_local;
  string *cc;
  
  std::__cxx11::string::string((string *)(rd.field_0.field2 + 0x1380));
  std::random_device::random_device((random_device *)local_13c0);
  rVar2 = std::random_device::operator()((random_device *)local_13c0);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&dist,
             (ulong)rVar2);
  lVar3 = std::__cxx11::stoll(&in_RSI->prefix,(size_t *)0x0,10);
  if (-1 < lVar3) {
    std::__cxx11::string::insert((ulong)((long)&rd.field_0 + 0x1380),(string *)0x0);
  }
  std::uniform_int_distribution<unsigned_int>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_int> *)&genreq,0,9);
  local_13e4 = std::__cxx11::string::length();
  i = 0x10 - local_13e4;
  do {
    local_13e9 = 0;
    std::__cxx11::string::string((string *)this,(string *)(rd.field_0.field2 + 0x1380));
    for (local_13f0 = 0; local_13f0 < i; local_13f0 = local_13f0 + 1) {
      psVar4 = (string *)std::__cxx11::string::length();
      rVar2 = std::uniform_int_distribution<unsigned_int>::operator()
                        ((uniform_int_distribution<unsigned_int> *)&genreq,
                         (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                         &dist);
      std::__cxx11::to_string(local_1410,rVar2);
      std::__cxx11::string::insert((ulong)this,psVar4);
      std::__cxx11::string::~string((string *)local_1410);
    }
    bVar1 = LuhnCheck(in_RSI,&this->prefix);
    if (bVar1) {
      local_13e9 = 1;
    }
    if ((local_13e9 & 1) == 0) {
      std::__cxx11::string::~string((string *)this);
    }
  } while (!bVar1);
  std::random_device::~random_device((random_device *)local_13c0);
  std::__cxx11::string::~string((string *)(rd.field_0.field2 + 0x1380));
  return this;
}

Assistant:

std::string xcard::generateCard()
{

    std::string cardbuf;

    /* Seed */
    std::random_device rd;

    /* Random number generator */
    std::default_random_engine generator(rd());

    if (std::stoll(this->prefix) > -1)
    {
        cardbuf.insert(0, this->prefix);
    }

    std::uniform_int_distribution<unsigned int> dist(0, 9);

    int initial_length = cardbuf.length();
    int genreq = 16 - initial_length;

    while (true)
    {

        std::string cc = cardbuf;
        
        for (int i = 0; i < genreq; i++)
        {
            cc.insert(cc.length(), std::to_string(dist(generator)));
        }

        if (LuhnCheck(cc) == true)
        {
            return cc;
        }
    }
}